

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilReader.c
# Opt level: O0

void * Extra_FileReaderGetTokens_int(Extra_FileReader_t *p)

{
  bool bVar1;
  char *pcVar2;
  int MapValue;
  int fTokenStarted;
  char *pChar;
  Extra_FileReader_t *p_local;
  
  if (p->fStop == 0) {
    p->vTokens->nSize = 0;
    p->vLines->nSize = 0;
    bVar1 = false;
    if (p->pBufferStop < p->pBufferCur) {
      Extra_FileReaderReload(p);
    }
    for (_MapValue = p->pBufferCur; _MapValue < p->pBufferEnd; _MapValue = _MapValue + 1) {
      if (*_MapValue == '\n') {
        p->nLineCounter = p->nLineCounter + 1;
      }
      switch(p->pCharMap[*_MapValue]) {
      case '\0':
        if ((*_MapValue == '/') && (_MapValue[1] != '/')) goto switchD_00517e5c_caseD_1;
        if (bVar1) {
          bVar1 = false;
        }
        while (*_MapValue != '\n') {
          pcVar2 = _MapValue + 1;
          *_MapValue = '\0';
          _MapValue = pcVar2;
          if (pcVar2 == p->pBufferEnd) {
            printf("Extra_FileReader failed to parse the file \"%s\".\n",p->pFileName);
            return (void *)0x0;
          }
        }
        _MapValue = _MapValue + -1;
        break;
      case '\x01':
switchD_00517e5c_caseD_1:
        if (!bVar1) {
          Vec_PtrPush(p->vTokens,_MapValue);
          Vec_IntPush(p->vLines,p->nLineCounter);
          bVar1 = true;
        }
        break;
      case '\x02':
        *_MapValue = '\0';
        p->pBufferCur = _MapValue + 1;
        return p->vTokens;
      case '\x03':
        if (bVar1) {
          bVar1 = false;
        }
        *_MapValue = '\0';
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilReader.c"
                      ,0x148,"void *Extra_FileReaderGetTokens_int(Extra_FileReader_t *)");
      }
    }
    if (p->pBufferStop == p->pBufferEnd) {
      *_MapValue = '\0';
      p->fStop = 1;
      p_local = (Extra_FileReader_t *)p->vTokens;
    }
    else {
      printf("Extra_FileReader failed to parse the file \"%s\".\n",p->pFileName);
      p_local = (Extra_FileReader_t *)0x0;
    }
  }
  else {
    p_local = (Extra_FileReader_t *)0x0;
  }
  return p_local;
}

Assistant:

void * Extra_FileReaderGetTokens_int( Extra_FileReader_t * p )
{
    char * pChar;
    int fTokenStarted, MapValue;
    if ( p->fStop )
        return NULL;
    // reset the token info
    p->vTokens->nSize = 0;
    p->vLines->nSize = 0;
    fTokenStarted = 0;
    // check if the new data should to be loaded
    if ( p->pBufferCur > p->pBufferStop )
        Extra_FileReaderReload( p );

//    printf( "%d\n", p->pBufferEnd - p->pBufferCur );

    // process the string starting from the current position
    for ( pChar = p->pBufferCur; pChar < p->pBufferEnd; pChar++ )
    {
        // count the lines
        if ( *pChar == '\n' )
            p->nLineCounter++;
        // switch depending on the character
        MapValue = p->pCharMap[(int)*pChar];

//        printf( "Char value = %d. Map value = %d.\n", *pChar, MapValue );


        switch ( MapValue )
        {
            case EXTRA_CHAR_COMMENT:
                if ( *pChar != '/' || *(pChar+1) == '/' ) 
                { // dealing with the need to have // as a comment
                    // if the token was being written, stop it
                    if ( fTokenStarted )
                        fTokenStarted = 0;
                    // eraze the comment till the end of line
                    while ( *pChar != '\n' )
                    {
                        *pChar++ = 0;
                        if ( pChar == p->pBufferEnd )
                        {   // this failure is due to the fact the comment continued 
                            // through EXTRA_OFFSET_SIZE chars till the end of the buffer
                            printf( "Extra_FileReader failed to parse the file \"%s\".\n", p->pFileName );
                            return NULL;
                        }
                    }
                    pChar--;
                    break;
                }
                // otherwise it is a normal character
            case EXTRA_CHAR_NORMAL:
                if ( !fTokenStarted )
                {
                    Vec_PtrPush( p->vTokens, pChar );
                    Vec_IntPush( p->vLines, p->nLineCounter );
                    fTokenStarted = 1;
                }
                break;
            case EXTRA_CHAR_STOP:
                if ( fTokenStarted )
                    fTokenStarted = 0;
                *pChar = 0;
                // prepare before leaving
                p->pBufferCur = pChar + 1;
                return p->vTokens;
            case EXTRA_CHAR_CLEAN:
                if ( fTokenStarted )
                    fTokenStarted = 0;
                *pChar = 0;
                break;
            default:
                assert( 0 );
        }
    }
    // the file is finished or the last part continued 
    // through EXTRA_OFFSET_SIZE chars till the end of the buffer
    if ( p->pBufferStop == p->pBufferEnd ) // end of file
    {
        *pChar = 0;
        p->fStop = 1;
        return p->vTokens;
    }
    printf( "Extra_FileReader failed to parse the file \"%s\".\n", p->pFileName );
/*
    {
        int i;
        for ( i = 0; i < p->vTokens->nSize; i++ )
            printf( "%s ", p->vTokens->pArray[i] );
        printf( "\n" );
    }
*/
    return NULL;
}